

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

ParseableFunctionInfo * __thiscall
Js::ParseableFunctionInfo::GetNestedFunctionForExecution(ParseableFunctionInfo *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  FunctionInfo *this_00;
  undefined4 *puVar4;
  FunctionProxy *this_01;
  ParseableFunctionInfo *pPVar5;
  FunctionInfo *currentNestedFunction;
  uint index_local;
  ParseableFunctionInfo *this_local;
  
  this_00 = GetNestedFunc(this,index);
  if (this_00 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x7fe,"(currentNestedFunction)","currentNestedFunction");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVar3 = FunctionInfo::IsDeferredDeserializeFunction(this_00);
  if (BVar3 != 0) {
    this_01 = FunctionInfo::GetFunctionProxy(this_00);
    FunctionProxy::EnsureDeserialized(this_01);
  }
  pPVar5 = FunctionInfo::GetParseableFunctionInfo(this_00);
  return pPVar5;
}

Assistant:

ParseableFunctionInfo* ParseableFunctionInfo::GetNestedFunctionForExecution(uint index)
    {
        FunctionInfo* currentNestedFunction = this->GetNestedFunc(index);
        Assert(currentNestedFunction);
        if (currentNestedFunction->IsDeferredDeserializeFunction())
        {
            currentNestedFunction->GetFunctionProxy()->EnsureDeserialized();
        }

        return currentNestedFunction->GetParseableFunctionInfo();
    }